

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestDyndepNotInput::Run(ParserTestDyndepNotInput *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1b0 [8];
  string err;
  ManifestParserOptions local_180;
  undefined1 local_178 [8];
  ManifestParser parser;
  State lstate;
  ParserTestDyndepNotInput *this_local;
  
  State::State((State *)&parser.quiet_);
  ManifestParserOptions::ManifestParserOptions(&local_180);
  ManifestParser::ManifestParser
            ((ManifestParser *)local_178,(State *)&parser.quiet_,(FileReader *)0x0,local_180);
  std::__cxx11::string::string((string *)local_1b0);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,
             "rule touch\n  command = touch $out\nbuild result: touch\n  dyndep = notin\n",
             &local_1d1);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_178,&local_1d0,(string *)local_1b0);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x454,
             "parser.ParseTest( \"rule touch\\n\" \"  command = touch $out\\n\" \"build result: touch\\n\" \"  dyndep = notin\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:5: dyndep \'notin\' is not an input\n",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x455,"\"input:5: dyndep \'notin\' is not an input\\n\" == err");
  std::__cxx11::string::~string((string *)local_1b0);
  State::~State((State *)&parser.quiet_);
  return;
}

Assistant:

TEST_F(ParserTest, DyndepNotInput) {
  State lstate;
  ManifestParser parser(&lstate, NULL);
  string err;
  EXPECT_FALSE(parser.ParseTest(
"rule touch\n"
"  command = touch $out\n"
"build result: touch\n"
"  dyndep = notin\n",
                               &err));
  EXPECT_EQ("input:5: dyndep 'notin' is not an input\n", err);
}